

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_threadnames_tests.cpp
# Opt level: O2

void __thiscall
util_threadnames_tests::util_threadnames_test_rename_threaded::test_method
          (util_threadnames_test_rename_threaded *this)

{
  long lVar1;
  iterator iVar2;
  int in_EDX;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  string *psVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  check_type cVar5;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  lazy_ostream local_138;
  undefined1 *local_128;
  char **local_120;
  assertion_result local_118;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  int local_dc;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  string local_a8;
  undefined1 local_88 [32];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RenameEnMasse_abi_cxx11_(&names,(util_threadnames_tests *)0x64,in_EDX);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_threadnames_tests.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x39;
  file.m_begin = (iterator)&local_b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c8,msg);
  local_88[8] = 0;
  local_88._0_8_ = &PTR__lazy_ostream_01139f30;
  local_88._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_88._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_threadnames_tests.cpp"
  ;
  local_d0 = "";
  psVar4 = &local_a8;
  local_a8._M_dataplus._M_p = (pointer)names._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_138._vptr_lazy_ostream = (_func_int **)CONCAT44(local_138._vptr_lazy_ostream._4_4_,100);
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_88,&local_d8,0x39,1,2,psVar4,"names.size()",&local_138,"100U");
  for (local_dc = 0; local_dc < 100; local_dc = local_dc + 1) {
    local_f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_threadnames_tests.cpp"
    ;
    local_e8 = "";
    local_100 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)psVar4;
    msg_00.m_begin = pvVar3;
    file_00.m_end = (iterator)0x3d;
    file_00.m_begin = (iterator)&local_f0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
               msg_00);
    util::ToString<int>(&local_a8,&local_dc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   TEST_THREAD_NAME_BASE_abi_cxx11_,&local_a8);
    _cVar5 = 0x5da5e2;
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&names._M_t,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ((_Rb_tree_header *)iVar2._M_node != &names._M_t._M_impl.super__Rb_tree_header);
    local_118.m_message.px = (element_type *)0x0;
    local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148 = "names.find(TEST_THREAD_NAME_BASE + ToString(i)) != names.end()";
    local_140 = "";
    local_138.m_empty = false;
    local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_128 = boost::unit_test::lazy_ostream::inst;
    local_120 = &local_148;
    local_158 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_threadnames_tests.cpp"
    ;
    local_150 = "";
    pvVar3 = &DAT_00000001;
    psVar4 = (string *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_118,&local_138,1,0,WARN,_cVar5,(size_t)&local_158,0x3d);
    boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&names._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_threadnames_test_rename_threaded)
{
    std::set<std::string> names = RenameEnMasse(100);

    BOOST_CHECK_EQUAL(names.size(), 100U);

    // Names "test_thread.[n]" should exist for n = [0, 99]
    for (int i = 0; i < 100; ++i) {
        BOOST_CHECK(names.find(TEST_THREAD_NAME_BASE + ToString(i)) != names.end());
    }

}